

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# javanano_map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::javanano::MapFieldGenerator::GenerateSerializedSizeCode
          (MapFieldGenerator *this,Printer *printer)

{
  Printer *printer_local;
  MapFieldGenerator *this_local;
  
  io::Printer::Print(printer,&this->variables_,
                     "if (this.$name$ != null) {\n  size += com.google.protobuf.nano.InternalNano.computeMapFieldSize(\n    this.$name$, $number$,\n  com.google.protobuf.nano.InternalNano.$key_desc_type$,\n  com.google.protobuf.nano.InternalNano.$value_desc_type$);\n}\n"
                    );
  return;
}

Assistant:

void MapFieldGenerator::
GenerateSerializedSizeCode(io::Printer* printer) const {
  printer->Print(variables_,
    "if (this.$name$ != null) {\n"
    "  size += com.google.protobuf.nano.InternalNano.computeMapFieldSize(\n"
    "    this.$name$, $number$,\n"
    "  com.google.protobuf.nano.InternalNano.$key_desc_type$,\n"
    "  com.google.protobuf.nano.InternalNano.$value_desc_type$);\n"
    "}\n");
}